

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

bool __thiscall anon_unknown.dwarf_153ab3::ObjCProtoName::isObjCObject(ObjCProtoName *this)

{
  Kind KVar1;
  bool local_31;
  StringView local_30;
  StringView local_20;
  ObjCProtoName *local_10;
  ObjCProtoName *this_local;
  
  local_10 = this;
  KVar1 = Node::getKind(this->Ty);
  local_31 = false;
  if (KVar1 == KNameType) {
    local_20 = NameType::getName((NameType *)this->Ty);
    StringView::StringView(&local_30,"objc_object");
    local_31 = ::operator==(&local_20,&local_30);
  }
  return local_31;
}

Assistant:

bool isObjCObject() const {
    return Ty->getKind() == KNameType &&
           static_cast<NameType *>(Ty)->getName() == "objc_object";
  }